

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntVect.H
# Opt level: O1

Box * __thiscall amrex::Box::coarsen(Box *this,int ref_ratio)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int dir;
  uint uVar6;
  long lVar7;
  int local_18 [6];
  
  local_18[3] = ref_ratio;
  local_18[4] = ref_ratio;
  local_18[5] = ref_ratio;
  if (ref_ratio == 1) {
    return this;
  }
  uVar1 = (this->smallend).vect[0];
  if (ref_ratio == 4) {
    if ((int)uVar1 < 0) {
      uVar1 = uVar1 + 1;
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 >> 2;
      goto LAB_00561bfa;
    }
    uVar1 = uVar1 >> 2;
  }
  else if (ref_ratio == 2) {
    if ((int)uVar1 < 0) {
      uVar1 = uVar1 + 1;
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 >> 1;
LAB_00561bfa:
      uVar1 = ~uVar4;
    }
    else {
      uVar1 = uVar1 >> 1;
    }
  }
  else {
    if ((int)uVar1 < 0) {
      iVar3 = uVar1 + 1;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      uVar4 = iVar2 / ref_ratio;
      goto LAB_00561bfa;
    }
    uVar1 = (int)uVar1 / ref_ratio;
  }
  (this->smallend).vect[0] = uVar1;
  uVar1 = (this->smallend).vect[1];
  if (ref_ratio != 1) {
    if (ref_ratio == 4) {
      if ((int)uVar1 < 0) {
        uVar1 = uVar1 + 1;
        uVar4 = -uVar1;
        if (0 < (int)uVar1) {
          uVar4 = uVar1;
        }
        uVar4 = uVar4 >> 2;
LAB_00561c43:
        uVar1 = ~uVar4;
      }
      else {
        uVar1 = uVar1 >> 2;
      }
    }
    else if (ref_ratio == 2) {
      if ((int)uVar1 < 0) {
        uVar1 = uVar1 + 1;
        uVar4 = -uVar1;
        if (0 < (int)uVar1) {
          uVar4 = uVar1;
        }
        uVar4 = uVar4 >> 1;
        goto LAB_00561c43;
      }
      uVar1 = uVar1 >> 1;
    }
    else if ((int)uVar1 < 0) {
      iVar3 = uVar1 + 1;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      uVar1 = ~(iVar2 / ref_ratio);
    }
    else {
      uVar1 = (int)uVar1 / ref_ratio;
    }
  }
  (this->smallend).vect[1] = uVar1;
  uVar1 = (this->smallend).vect[2];
  if (ref_ratio != 1) {
    if (ref_ratio == 4) {
      if ((int)uVar1 < 0) {
        uVar1 = uVar1 + 1;
        uVar4 = -uVar1;
        if (0 < (int)uVar1) {
          uVar4 = uVar1;
        }
        uVar4 = uVar4 >> 2;
LAB_00561ca1:
        uVar1 = ~uVar4;
      }
      else {
        uVar1 = uVar1 >> 2;
      }
    }
    else if (ref_ratio == 2) {
      if ((int)uVar1 < 0) {
        uVar1 = uVar1 + 1;
        uVar4 = -uVar1;
        if (0 < (int)uVar1) {
          uVar4 = uVar1;
        }
        uVar4 = uVar4 >> 1;
        goto LAB_00561ca1;
      }
      uVar1 = uVar1 >> 1;
    }
    else if ((int)uVar1 < 0) {
      iVar3 = uVar1 + 1;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      uVar1 = ~(iVar2 / ref_ratio);
    }
    else {
      uVar1 = (int)uVar1 / ref_ratio;
    }
  }
  (this->smallend).vect[2] = uVar1;
  uVar1 = (this->btype).itype;
  if (uVar1 == 0) {
    uVar1 = (this->bigend).vect[0];
    if (ref_ratio != 1) {
      if (ref_ratio == 4) {
        if ((int)uVar1 < 0) {
          uVar1 = uVar1 + 1;
          uVar4 = -uVar1;
          if (0 < (int)uVar1) {
            uVar4 = uVar1;
          }
          uVar4 = uVar4 >> 2;
LAB_00561eae:
          uVar1 = ~uVar4;
        }
        else {
          uVar1 = uVar1 >> 2;
        }
      }
      else if (ref_ratio == 2) {
        if ((int)uVar1 < 0) {
          uVar1 = uVar1 + 1;
          uVar4 = -uVar1;
          if (0 < (int)uVar1) {
            uVar4 = uVar1;
          }
          uVar4 = uVar4 >> 1;
          goto LAB_00561eae;
        }
        uVar1 = uVar1 >> 1;
      }
      else if ((int)uVar1 < 0) {
        iVar3 = uVar1 + 1;
        iVar2 = -iVar3;
        if (0 < iVar3) {
          iVar2 = iVar3;
        }
        uVar1 = ~(iVar2 / ref_ratio);
      }
      else {
        uVar1 = (int)uVar1 / ref_ratio;
      }
    }
    (this->bigend).vect[0] = uVar1;
    uVar1 = (this->bigend).vect[1];
    if (ref_ratio != 1) {
      if (ref_ratio == 4) {
        if ((int)uVar1 < 0) {
          uVar1 = uVar1 + 1;
          uVar4 = -uVar1;
          if (0 < (int)uVar1) {
            uVar4 = uVar1;
          }
          uVar4 = uVar4 >> 2;
LAB_00561f0c:
          uVar1 = ~uVar4;
        }
        else {
          uVar1 = uVar1 >> 2;
        }
      }
      else if (ref_ratio == 2) {
        if ((int)uVar1 < 0) {
          uVar1 = uVar1 + 1;
          uVar4 = -uVar1;
          if (0 < (int)uVar1) {
            uVar4 = uVar1;
          }
          uVar4 = uVar4 >> 1;
          goto LAB_00561f0c;
        }
        uVar1 = uVar1 >> 1;
      }
      else if ((int)uVar1 < 0) {
        iVar3 = uVar1 + 1;
        iVar2 = -iVar3;
        if (0 < iVar3) {
          iVar2 = iVar3;
        }
        uVar1 = ~(iVar2 / ref_ratio);
      }
      else {
        uVar1 = (int)uVar1 / ref_ratio;
      }
    }
    (this->bigend).vect[1] = uVar1;
    uVar1 = (this->bigend).vect[2];
    if (ref_ratio == 1) goto LAB_00561e8e;
    if (ref_ratio == 4) {
      if (-1 < (int)uVar1) {
        uVar1 = uVar1 >> 2;
        goto LAB_00561e8e;
      }
      uVar1 = uVar1 + 1;
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 >> 2;
    }
    else {
      if (ref_ratio != 2) {
        if ((int)uVar1 < 0) {
          iVar3 = uVar1 + 1;
          iVar2 = -iVar3;
          if (0 < iVar3) {
            iVar2 = iVar3;
          }
          uVar1 = ~(iVar2 / ref_ratio);
        }
        else {
          uVar1 = (int)uVar1 / ref_ratio;
        }
        goto LAB_00561e8e;
      }
      if (-1 < (int)uVar1) {
        uVar1 = uVar1 >> 1;
        goto LAB_00561e8e;
      }
      uVar1 = uVar1 + 1;
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 >> 1;
    }
    uVar1 = ~uVar4;
    goto LAB_00561e8e;
  }
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  lVar7 = 0;
  do {
    if (((uVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0) &&
       ((this->bigend).vect[lVar7] % local_18[lVar7 + 3] != 0)) {
      local_18[lVar7] = 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  uVar4 = (this->bigend).vect[0];
  if (ref_ratio != 1) {
    if (ref_ratio == 4) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar1 = -uVar4;
        if (0 < (int)uVar4) {
          uVar1 = uVar4;
        }
        uVar1 = uVar1 >> 2;
LAB_00561d8f:
        uVar4 = ~uVar1;
      }
      else {
        uVar4 = uVar4 >> 2;
      }
    }
    else if (ref_ratio == 2) {
      if ((int)uVar4 < 0) {
        uVar4 = uVar4 + 1;
        uVar1 = -uVar4;
        if (0 < (int)uVar4) {
          uVar1 = uVar4;
        }
        uVar1 = uVar1 >> 1;
        goto LAB_00561d8f;
      }
      uVar4 = uVar4 >> 1;
    }
    else if ((int)uVar4 < 0) {
      iVar3 = uVar4 + 1;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      uVar4 = ~(iVar2 / ref_ratio);
    }
    else {
      uVar4 = (int)uVar4 / ref_ratio;
    }
  }
  (this->bigend).vect[0] = uVar4;
  uVar6 = (this->bigend).vect[1];
  if (ref_ratio != 1) {
    if (ref_ratio == 4) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar1 = -uVar6;
        if (0 < (int)uVar6) {
          uVar1 = uVar6;
        }
        uVar1 = uVar1 >> 2;
LAB_00561dfc:
        uVar6 = ~uVar1;
      }
      else {
        uVar6 = uVar6 >> 2;
      }
    }
    else if (ref_ratio == 2) {
      if ((int)uVar6 < 0) {
        uVar6 = uVar6 + 1;
        uVar1 = -uVar6;
        if (0 < (int)uVar6) {
          uVar1 = uVar6;
        }
        uVar1 = uVar1 >> 1;
        goto LAB_00561dfc;
      }
      uVar6 = uVar6 >> 1;
    }
    else if ((int)uVar6 < 0) {
      iVar3 = uVar6 + 1;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      uVar6 = ~(iVar2 / ref_ratio);
    }
    else {
      uVar6 = (int)uVar6 / ref_ratio;
    }
  }
  (this->bigend).vect[1] = uVar6;
  uVar1 = (this->bigend).vect[2];
  if (ref_ratio != 1) {
    if (ref_ratio == 4) {
      if ((int)uVar1 < 0) {
        uVar1 = uVar1 + 1;
        uVar5 = -uVar1;
        if (0 < (int)uVar1) {
          uVar5 = uVar1;
        }
        uVar5 = uVar5 >> 2;
LAB_00561e61:
        uVar1 = ~uVar5;
      }
      else {
        uVar1 = uVar1 >> 2;
      }
    }
    else if (ref_ratio == 2) {
      if ((int)uVar1 < 0) {
        uVar1 = uVar1 + 1;
        uVar5 = -uVar1;
        if (0 < (int)uVar1) {
          uVar5 = uVar1;
        }
        uVar5 = uVar5 >> 1;
        goto LAB_00561e61;
      }
      uVar1 = uVar1 >> 1;
    }
    else if ((int)uVar1 < 0) {
      iVar3 = uVar1 + 1;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      uVar1 = ~(iVar2 / ref_ratio);
    }
    else {
      uVar1 = (int)uVar1 / ref_ratio;
    }
  }
  (this->bigend).vect[2] = uVar1;
  (this->bigend).vect[0] = uVar4 + local_18[0];
  (this->bigend).vect[1] = uVar6 + local_18[1];
  uVar1 = uVar1 + local_18[2];
LAB_00561e8e:
  (this->bigend).vect[2] = uVar1;
  return this;
}

Assistant:

constexpr IntVect (int i) noexcept : vect{AMREX_D_DECL(i,i,i)} {}